

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cinatra::coro_http_server::
build_part_heads<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,coro_http_server *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *ranges,
          string_view mime,string_view file_size_str,size_t *content_len)

{
  pointer ppVar1;
  pair<int,_int> pVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> pbVar4;
  pointer ppVar5;
  int __val;
  int __val_00;
  string part_header;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_a0._M_str = mime._M_str;
  local_a0._M_len = mime._M_len;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar1 = (ranges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (ranges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    pVar2 = *ppVar5;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"--",(allocator<char> *)&local_50);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_90,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        BOUNDARY_abi_cxx11_);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &CRCF_abi_cxx11_);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_90,"Content-Type: ");
    pbVar4 = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                       ((string *)pbVar3,&local_a0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (pbVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &CRCF_abi_cxx11_);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_90,"Content-Range: ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (pbVar3,"bytes ");
    __val_00 = pVar2.first;
    std::__cxx11::to_string(&local_50,__val_00);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_90,&local_50);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (pbVar3,"-");
    __val = pVar2.second;
    std::__cxx11::to_string(&local_70,__val);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (pbVar3,&local_70);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (pbVar3,"/");
    pbVar4 = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                       ((string *)pbVar3,&file_size_str);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (pbVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &TWO_CRCF_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    *content_len = *content_len + local_90._M_string_length;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_90);
    *content_len = *content_len + ((__val - __val_00) + 1) + DAT_001b2af0;
    std::__cxx11::string::~string((string *)&local_90);
  }
  *content_len = BOUNDARY_abi_cxx11_._8_8_ + *content_len + 4;
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> build_part_heads(auto &ranges, std::string_view mime,
                                            std::string_view file_size_str,
                                            size_t &content_len) {
    std::vector<std::string> multi_heads;
    for (auto [start, end] : ranges) {
      std::string part_header = "--";
      part_header.append(BOUNDARY).append(CRCF);
      part_header.append("Content-Type: ").append(mime).append(CRCF);
      part_header.append("Content-Range: ").append("bytes ");
      part_header.append(std::to_string(start))
          .append("-")
          .append(std::to_string(end))
          .append("/")
          .append(file_size_str)
          .append(TWO_CRCF);
      content_len += part_header.size();
      multi_heads.push_back(std::move(part_header));
      size_t part_size = end + 1 - start + CRCF.size();
      content_len += part_size;
    }
    content_len += (BOUNDARY.size() + 4);
    return multi_heads;
  }